

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  ArrayElement *pAVar1;
  TestCaseGroup *pTVar2;
  bool extendedCases;
  SharedPtr sized;
  ProgramResourceQueryTestTarget queryTarget;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_BUFFER_VARIABLE,4);
  if ((*(char *)&parentStructure->m_ptr[1]._vptr_Node == '\x01') &&
     (((parentStructure->m_ptr->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT)) {
    pTVar2 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar2,context,"non_array","Non-array target");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar2);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,1,false);
    extendedCases = true;
  }
  else {
    extendedCases = false;
  }
  pAVar1 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar1,parentStructure,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&sized,(Node *)pAVar1);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,context,"sized","Sized target");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar2);
  generateBufferVariableArraySizeSubCases
            (context,&sized,(TestCaseGroup *)pTVar2,PROGRAMRESOURCEPROP_ARRAY_STRIDE,true,
             extendedCases);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&sized);
  pAVar1 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar1,parentStructure,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&sized,(Node *)pAVar1);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,context,"unsized","Unsized target");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar2);
  generateBufferVariableArraySizeSubCases
            (context,&sized,(TestCaseGroup *)pTVar2,PROGRAMRESOURCEPROP_ARRAY_STRIDE,false,
             extendedCases);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&sized);
  return;
}

Assistant:

static void generateBufferVariableArrayCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp);
	const bool								namedNonArrayBlock	= static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named && parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	// .non_array
	if (namedNonArrayBlock)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "non_array", "Non-array target");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, 1, false);
	}

	// .sized
	{
		const ResourceDefinition::Node::SharedPtr	sized		(new ResourceDefinition::ArrayElement(parentStructure));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, sized, blockGroup, TargetProp, true, namedNonArrayBlock);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, unsized, blockGroup, TargetProp, false, namedNonArrayBlock);
	}
}